

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::base::CircularQueue<perfetto::TracingServiceImpl::TriggerHistory>::erase_front
          (CircularQueue<perfetto::TracingServiceImpl::TriggerHistory> *this,size_t n)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = this->begin_;
  while ((bVar2 = n != 0, n = n - 1, bVar2 && (uVar1 < this->end_))) {
    uVar1 = uVar1 + 1;
    this->begin_ = uVar1;
  }
  return;
}

Assistant:

void erase_front(size_t n) {
    increment_generation();
    for (; n && (begin_ < end_); --n) {
      Get(begin_)->~T();
      begin_++;  // This needs to be its own statement, Get() checks begin_.
    }
  }